

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSValue js_object_getOwnPropertyDescriptors(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  int iVar1;
  ulong uVar3;
  JSValueUnion JVar4;
  ulong uVar5;
  JSValue this_val_00;
  JSValue this_obj;
  JSValue v;
  JSValue v_00;
  JSValue JVar6;
  JSValue JVar7;
  JSValue JVar8;
  JSValue val;
  uint32_t len;
  int64_t local_98;
  int64_t local_90;
  JSValueUnion local_88;
  JSValueUnion local_80;
  ulong local_78;
  JSPropertyEnum *props;
  ulong local_68;
  JSValueUnion local_60;
  JSValueUnion local_58;
  int64_t local_50;
  JSValue local_48;
  JSValueUnion p;
  int64_t iVar2;
  
  JVar6 = JS_ToObject(ctx,*argv);
  iVar2 = JVar6.tag;
  p = JVar6.u;
  if ((int)JVar6.tag != 6) {
    local_80 = p;
    iVar1 = JS_GetOwnPropertyNamesInternal(ctx,&props,&len,(JSObject *)p.ptr,3);
    if (iVar1 == 0) {
      JVar6 = JS_NewObject(ctx);
      uVar3 = (ulong)JVar6.u.ptr >> 0x20;
      if ((int)JVar6.tag != 6) {
        uVar5 = 0;
        local_98 = iVar2;
        local_78 = (ulong)len;
        local_68 = uVar3;
        while( true ) {
          local_90 = JVar6.tag;
          iVar2 = local_90;
          local_88 = JVar6.u;
          JVar4 = local_88;
          if (local_78 == uVar5) break;
          JVar4._4_4_ = 0;
          JVar4.int32 = props[uVar5].atom;
          JVar6 = JS_AtomToValue(ctx,props[uVar5].atom);
          this_val_00.tag = JVar6.tag;
          if ((int)JVar6.tag == 6) {
LAB_00152352:
            JVar6.tag = local_90;
            JVar6.u.ptr = local_88.ptr;
            len = (uint32_t)local_78;
            uVar3 = local_68;
            iVar2 = local_98;
            goto LAB_00152371;
          }
          local_58.float64 = local_80.float64;
          local_50 = local_98;
          this_val_00.u.float64 = JVar4.float64;
          local_48 = JVar6;
          JVar7 = js_object_getOwnPropertyDescriptor(ctx,this_val_00,p.int32,(JSValue *)&local_58,0)
          ;
          local_60 = JVar7.u;
          JS_FreeValue(ctx,JVar6);
          if ((int)JVar7.tag != 3) {
            if ((int)JVar7.tag != 6) {
              p._4_4_ = 0;
              p.int32 = props[uVar5].atom;
              this_obj.tag = local_90;
              this_obj.u.ptr = local_88.ptr;
              val.tag = JVar7.tag;
              val.u.float64 = local_60.float64;
              iVar1 = JS_DefinePropertyValue(ctx,this_obj,props[uVar5].atom,val,0x4007);
              if (-1 < iVar1) goto LAB_00152338;
            }
            goto LAB_00152352;
          }
LAB_00152338:
          JVar6.tag = local_90;
          JVar6.u.ptr = local_88.ptr;
          uVar5 = uVar5 + 1;
        }
        js_free_prop_enum(ctx,props,(uint32_t)local_78);
        JVar7.tag = local_98;
        JVar7.u.ptr = local_80.ptr;
        JS_FreeValue(ctx,JVar7);
        uVar5 = (ulong)JVar4.ptr & 0xffffffff00000000;
        uVar3 = (ulong)JVar4.ptr & 0xffffffff;
        goto LAB_001523a7;
      }
    }
    else {
      JVar6 = (JSValue)(ZEXT816(3) << 0x40);
      uVar3 = 0;
    }
LAB_00152371:
    js_free_prop_enum(ctx,props,len);
    v.tag = iVar2;
    v.u.ptr = local_80.ptr;
    JS_FreeValue(ctx,v);
    v_00.u.ptr = (void *)((ulong)JVar6.u.ptr & 0xffffffff | uVar3 << 0x20);
    v_00.tag = JVar6.tag;
    JS_FreeValue(ctx,v_00);
  }
  iVar2 = 6;
  uVar3 = 0;
  uVar5 = 0;
LAB_001523a7:
  JVar8.u.ptr = (void *)(uVar3 | uVar5);
  JVar8.tag = iVar2;
  return JVar8;
}

Assistant:

static JSValue js_object_getOwnPropertyDescriptors(JSContext *ctx, JSValueConst this_val,
                                                   int argc, JSValueConst *argv)
{
    //getOwnPropertyDescriptors(obj)
    JSValue obj, r;
    JSObject *p;
    JSPropertyEnum *props;
    uint32_t len, i;

    r = JS_UNDEFINED;
    obj = JS_ToObject(ctx, argv[0]);
    if (JS_IsException(obj))
        return JS_EXCEPTION;

    p = JS_VALUE_GET_OBJ(obj);
    if (JS_GetOwnPropertyNamesInternal(ctx, &props, &len, p,
                               JS_GPN_STRING_MASK | JS_GPN_SYMBOL_MASK))
        goto exception;
    r = JS_NewObject(ctx);
    if (JS_IsException(r))
        goto exception;
    for(i = 0; i < len; i++) {
        JSValue atomValue, desc;
        JSValueConst args[2];

        atomValue = JS_AtomToValue(ctx, props[i].atom);
        if (JS_IsException(atomValue))
            goto exception;
        args[0] = obj;
        args[1] = atomValue;
        desc = js_object_getOwnPropertyDescriptor(ctx, JS_UNDEFINED, 2, args, 0);
        JS_FreeValue(ctx, atomValue);
        if (JS_IsException(desc))
            goto exception;
        if (!JS_IsUndefined(desc)) {
            if (JS_DefinePropertyValue(ctx, r, props[i].atom, desc,
                                       JS_PROP_C_W_E | JS_PROP_THROW) < 0)
                goto exception;
        }
    }
    js_free_prop_enum(ctx, props, len);
    JS_FreeValue(ctx, obj);
    return r;

exception:
    js_free_prop_enum(ctx, props, len);
    JS_FreeValue(ctx, obj);
    JS_FreeValue(ctx, r);
    return JS_EXCEPTION;
}